

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_plan_serialization.cpp
# Opt level: O2

void test_helper(string *sql,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *fixtures)

{
  pointer pbVar1;
  idx_t iVar2;
  ParserOptions PVar3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  pointer pSVar5;
  type pCVar6;
  type pBVar7;
  pointer pLVar8;
  pointer this;
  pointer pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fixture;
  pointer pbVar10;
  DuckDB db;
  Connection con;
  string statement_sql;
  Parser p;
  Optimizer optimizer;
  Planner planner;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2b0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2a8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2a0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_298;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_290;
  long *local_288;
  long *local_280;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  DuckDB local_258 [16];
  Connection local_248 [32];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_208 [2];
  Optimizer local_1d8 [96];
  LogicalOperator *local_178 [14];
  shared_ptr<duckdb::Binder,_true> local_108 [216];
  
  duckdb::DuckDB::DuckDB(local_258,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(local_248,local_258);
  pbVar1 = (fixtures->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar10 = (fixtures->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1; pbVar10 = pbVar10 + 1
      ) {
    duckdb::Connection::SendQuery((string *)&local_280);
    if (local_280 != (long *)0x0) {
      (**(code **)(*local_280 + 8))();
    }
    local_280 = (long *)0x0;
  }
  local_270 = 1;
  uStack_268 = 1000;
  local_260 = 0;
  PVar3.max_expression_depth = 1000;
  PVar3.preserve_identifier_case = true;
  PVar3.integer_division = false;
  PVar3._2_6_ = 0;
  PVar3.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
  duckdb::Parser::Parser((Parser *)local_208,PVar3);
  duckdb::Parser::ParseQuery((string *)local_208);
  local_278 = local_208[0].
              super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (this = local_208[0].
              super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != local_278; this = this + 1) {
    duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
              ((shared_ptr<duckdb::ClientContext,_true> *)local_248);
    duckdb::TransactionContext::BeginTransaction();
    pSVar5 = duckdb::
             unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(this);
    pcVar9 = (pSVar5->query)._M_dataplus._M_p;
    pSVar5 = duckdb::
             unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(this);
    iVar2 = pSVar5->stmt_location;
    pSVar5 = duckdb::
             unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(this);
    pcVar9 = pcVar9 + iVar2;
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,pcVar9,pcVar9 + pSVar5->stmt_length);
    pCVar6 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                       ((shared_ptr<duckdb::ClientContext,_true> *)local_248);
    duckdb::Planner::Planner((Planner *)local_178,pCVar6);
    local_290._M_head_impl =
         (this->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (this->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
    duckdb::Planner::CreatePlan((Planner *)local_178,&local_290);
    if (local_290._M_head_impl != (SQLStatement *)0x0) {
      (*(local_290._M_head_impl)->_vptr_SQLStatement[1])();
    }
    local_290._M_head_impl = (SQLStatement *)0x0;
    local_2a8._M_head_impl = local_178[0];
    local_178[0] = (LogicalOperator *)0x0;
    pBVar7 = duckdb::shared_ptr<duckdb::Binder,_true>::operator*(local_108);
    pCVar6 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                       ((shared_ptr<duckdb::ClientContext,_true> *)local_248);
    duckdb::Optimizer::Optimizer(local_1d8,pBVar7,pCVar6);
    local_298._M_head_impl = local_2a8._M_head_impl;
    local_2a8._M_head_impl = (LogicalOperator *)0x0;
    duckdb::Optimizer::Optimize(&local_2b0,local_1d8,&local_298);
    _Var4._M_head_impl = local_2a8._M_head_impl;
    local_2a8._M_head_impl = local_2b0._M_head_impl;
    local_2b0._M_head_impl = (LogicalOperator *)0x0;
    if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var4._M_head_impl + 8))();
      if (local_2b0._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
      }
    }
    local_2b0._M_head_impl = (LogicalOperator *)0x0;
    if (local_298._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_298._M_head_impl + 8))();
    }
    local_298._M_head_impl = (LogicalOperator *)0x0;
    pLVar8 = duckdb::
             unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_2a8);
    pCVar6 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                       ((shared_ptr<duckdb::ClientContext,_true> *)local_248);
    (**(code **)(*(long *)pLVar8 + 0x48))(&local_2b0,pLVar8,pCVar6);
    local_2a0._M_head_impl = local_2b0._M_head_impl;
    local_2b0._M_head_impl = (LogicalOperator *)0x0;
    duckdb::Optimizer::Optimize(&local_288,local_1d8,&local_2a0);
    if (local_2a0._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_2a0._M_head_impl + 8))();
    }
    local_2a0._M_head_impl = (LogicalOperator *)0x0;
    duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
              ((shared_ptr<duckdb::ClientContext,_true> *)local_248);
    duckdb::TransactionContext::Commit();
    if (local_288 != (long *)0x0) {
      (**(code **)(*local_288 + 8))();
    }
    if (local_2b0._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
    }
    duckdb::Optimizer::~Optimizer(local_1d8);
    if (local_2a8._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_2a8._M_head_impl + 8))();
    }
    duckdb::Planner::~Planner((Planner *)local_178);
    std::__cxx11::string::~string((string *)local_228);
  }
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector(local_208);
  duckdb::Connection::~Connection(local_248);
  duckdb::DuckDB::~DuckDB(local_258);
  return;
}

Assistant:

static void test_helper(string sql, duckdb::vector<string> fixtures = duckdb::vector<string>()) {
	DuckDB db;
	Connection con(db);

	for (const auto &fixture : fixtures) {
		con.SendQuery(fixture);
	}

	Parser p;
	p.ParseQuery(sql);

	for (auto &statement : p.statements) {
		con.context->transaction.BeginTransaction();
		// Should that be the default "ToString"?
		string statement_sql(statement->query.c_str() + statement->stmt_location, statement->stmt_length);
		Planner planner(*con.context);
		planner.CreatePlan(std::move(statement));
		auto plan = std::move(planner.plan);

		Optimizer optimizer(*planner.binder, *con.context);

		plan = optimizer.Optimize(std::move(plan));

		// LogicalOperator's copy utilizes its serialize and deserialize methods
		auto new_plan = plan->Copy(*con.context);

		auto optimized_plan = optimizer.Optimize(std::move(new_plan));
		con.context->transaction.Commit();
	}
}